

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::Image::ImageTestCase::ImageTestCase
          (ImageTestCase *this,EglTestContext *eglTestCtx,ApiType api,string *name,string *desc)

{
  char *name_00;
  char *description;
  TestLog *log;
  string *desc_local;
  string *name_local;
  EglTestContext *eglTestCtx_local;
  ImageTestCase *this_local;
  ApiType api_local;
  
  name_00 = (char *)std::__cxx11::string::c_str();
  description = (char *)std::__cxx11::string::c_str();
  egl::TestCase::TestCase(&this->super_TestCase,eglTestCtx,name_00,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ImageTestCase_0326d0e8;
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper(&this->super_CallLogWrapper,&this->m_gl,log);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ImageTestCase_0326d0e8;
  glw::Functions::Functions(&this->m_gl);
  (this->m_api).m_bits = api.m_bits;
  this->m_display = (EGLDisplay)0x0;
  return;
}

Assistant:

ImageTestCase		(EglTestContext& eglTestCtx, ApiType api, const string& name, const string& desc)
					: TestCase				(eglTestCtx, name.c_str(), desc.c_str())
					, glu::CallLogWrapper	(m_gl, m_testCtx.getLog())
					, m_api					(api)
					, m_display				(EGL_NO_DISPLAY)
	{
	}